

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meta_pipeline.cpp
# Opt level: O3

Pipeline * __thiscall
duckdb::MetaPipeline::CreateUnionPipeline(MetaPipeline *this,Pipeline *current,bool order_matters)

{
  reference_map_t<Pipeline,_vector<reference<Pipeline>_>_> *this_00;
  pointer prVar1;
  _Hash_node_base *p_Var2;
  iterator __position;
  Pipeline *pPVar3;
  __node_base_ptr p_Var4;
  vector<std::reference_wrapper<duckdb::Pipeline>,_std::allocator<std::reference_wrapper<duckdb::Pipeline>_>_>
  *this_01;
  vector<std::reference_wrapper<duckdb::Pipeline>,std::allocator<std::reference_wrapper<duckdb::Pipeline>>>
  *this_02;
  __hash_code __code;
  key_type local_58;
  reference_wrapper<duckdb::Pipeline> local_50;
  vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
  local_48;
  
  pPVar3 = CreatePipeline(this);
  ::std::
  vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
  ::vector(&local_48,
           &(current->operators).
            super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
          );
  prVar1 = (pPVar3->operators).
           super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
           .
           super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  (pPVar3->operators).
  super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_48.
       super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (pPVar3->operators).
  super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_48.
       super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (pPVar3->operators).
  super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_48.
       super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_48.
  super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (prVar1 != (pointer)0x0) {
    operator_delete(prVar1);
    if (local_48.
        super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.
                      super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  (pPVar3->sink).ptr = (this->sink).ptr;
  pPVar3->base_batch_index = 0;
  ::std::
  vector<duckdb::weak_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::weak_ptr<duckdb::Pipeline,_true>_>_>
  ::operator=(&(pPVar3->dependencies).
               super_vector<duckdb::weak_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::weak_ptr<duckdb::Pipeline,_true>_>_>
              ,&(current->dependencies).
                super_vector<duckdb::weak_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::weak_ptr<duckdb::Pipeline,_true>_>_>
             );
  this_00 = &this->pipeline_dependencies;
  local_58._M_data = current;
  p_Var4 = ::std::
           _Hashtable<std::reference_wrapper<duckdb::Pipeline>,_std::pair<const_std::reference_wrapper<duckdb::Pipeline>,_duckdb::vector<std::reference_wrapper<duckdb::Pipeline>,_true>_>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::Pipeline>,_duckdb::vector<std::reference_wrapper<duckdb::Pipeline>,_true>_>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<duckdb::Pipeline>,_duckdb::ReferenceHashFunction<duckdb::Pipeline>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_before_node
                     (&this_00->_M_h,
                      (ulong)current % (this->pipeline_dependencies)._M_h._M_bucket_count,&local_58,
                      (__hash_code)current);
  if ((p_Var4 != (__node_base_ptr)0x0) &&
     (p_Var2 = p_Var4->_M_nxt, p_Var2 != (_Hash_node_base *)0x0)) {
    local_58._M_data = pPVar3;
    this_01 = &::std::__detail::
               _Map_base<std::reference_wrapper<duckdb::Pipeline>,_std::pair<const_std::reference_wrapper<duckdb::Pipeline>,_duckdb::vector<std::reference_wrapper<duckdb::Pipeline>,_true>_>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::Pipeline>,_duckdb::vector<std::reference_wrapper<duckdb::Pipeline>,_true>_>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<duckdb::Pipeline>,_duckdb::ReferenceHashFunction<duckdb::Pipeline>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::reference_wrapper<duckdb::Pipeline>,_std::pair<const_std::reference_wrapper<duckdb::Pipeline>,_duckdb::vector<std::reference_wrapper<duckdb::Pipeline>,_true>_>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::Pipeline>,_duckdb::vector<std::reference_wrapper<duckdb::Pipeline>,_true>_>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<duckdb::Pipeline>,_duckdb::ReferenceHashFunction<duckdb::Pipeline>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)this_00,&local_58)->
               super_vector<std::reference_wrapper<duckdb::Pipeline>,_std::allocator<std::reference_wrapper<duckdb::Pipeline>_>_>
    ;
    ::std::
    vector<std::reference_wrapper<duckdb::Pipeline>,_std::allocator<std::reference_wrapper<duckdb::Pipeline>_>_>
    ::operator=(this_01,(vector<std::reference_wrapper<duckdb::Pipeline>,_std::allocator<std::reference_wrapper<duckdb::Pipeline>_>_>
                         *)(p_Var2 + 2));
  }
  if (order_matters) {
    local_58._M_data = pPVar3;
    this_02 = (vector<std::reference_wrapper<duckdb::Pipeline>,std::allocator<std::reference_wrapper<duckdb::Pipeline>>>
               *)::std::__detail::
                 _Map_base<std::reference_wrapper<duckdb::Pipeline>,_std::pair<const_std::reference_wrapper<duckdb::Pipeline>,_duckdb::vector<std::reference_wrapper<duckdb::Pipeline>,_true>_>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::Pipeline>,_duckdb::vector<std::reference_wrapper<duckdb::Pipeline>,_true>_>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<duckdb::Pipeline>,_duckdb::ReferenceHashFunction<duckdb::Pipeline>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::reference_wrapper<duckdb::Pipeline>,_std::pair<const_std::reference_wrapper<duckdb::Pipeline>,_duckdb::vector<std::reference_wrapper<duckdb::Pipeline>,_true>_>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::Pipeline>,_duckdb::vector<std::reference_wrapper<duckdb::Pipeline>,_true>_>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<duckdb::Pipeline>,_duckdb::ReferenceHashFunction<duckdb::Pipeline>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)this_00,&local_58);
    __position._M_current = *(reference_wrapper<duckdb::Pipeline> **)(this_02 + 8);
    if (__position._M_current == *(reference_wrapper<duckdb::Pipeline> **)(this_02 + 0x10)) {
      local_50._M_data = current;
      ::std::
      vector<std::reference_wrapper<duckdb::Pipeline>,std::allocator<std::reference_wrapper<duckdb::Pipeline>>>
      ::_M_realloc_insert<std::reference_wrapper<duckdb::Pipeline>>(this_02,__position,&local_50);
    }
    else {
      (__position._M_current)->_M_data = current;
      *(long *)(this_02 + 8) = *(long *)(this_02 + 8) + 8;
    }
  }
  return pPVar3;
}

Assistant:

Pipeline &MetaPipeline::CreateUnionPipeline(Pipeline &current, bool order_matters) {
	// create the union pipeline (batch index 0, should be set correctly afterwards)
	auto &union_pipeline = CreatePipeline();
	state.SetPipelineOperators(union_pipeline, state.GetPipelineOperators(current));
	state.SetPipelineSink(union_pipeline, sink, 0);

	// 'union_pipeline' inherits ALL dependencies of 'current' (within this MetaPipeline, and across MetaPipelines)
	union_pipeline.dependencies = current.dependencies;
	auto it = pipeline_dependencies.find(current);
	if (it != pipeline_dependencies.end()) {
		pipeline_dependencies[union_pipeline] = it->second;
	}

	if (order_matters) {
		// if we need to preserve order, or if the sink is not parallel, we set a dependency
		pipeline_dependencies[union_pipeline].push_back(current);
	}

	return union_pipeline;
}